

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rbuSetupCheckpoint(sqlite3rbu *p,RbuState *pState)

{
  sqlite3_file *psVar1;
  sqlite3_file *psVar2;
  int iVar3;
  int iVar4;
  u8 *puVar5;
  i64 iVar6;
  u32 *ptr;
  void *local_20;
  
  if ((pState == (RbuState *)0x0) && (p->eStage = 0, p->rc == 0)) {
    iVar3 = sqlite3_exec(p->dbMain,"SELECT * FROM sqlite_master",(sqlite3_callback)0x0,(void *)0x0,
                         (char **)0x0);
    p->rc = iVar3;
  }
  if (p->rc == 0) {
    p->eStage = 3;
    iVar3 = sqlite3_exec(p->dbMain,"PRAGMA main.wal_checkpoint=restart",(sqlite3_callback)0x0,
                         (void *)0x0,(char **)0x0);
    if (iVar3 != 2) {
      p->rc = iVar3;
    }
  }
  if ((p->rc == 0) && (0 < p->nFrame)) {
    p->eStage = 4;
    if (pState == (RbuState *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = pState->nRow;
    }
    p->nStep = iVar3;
    puVar5 = (u8 *)rbuMalloc(p,(long)p->pgsz);
    p->aBuf = puVar5;
    if (p->rc == 0) {
      psVar1 = p->pTargetFd->pReal;
      iVar6 = 0;
      iVar3 = (*psVar1->pMethods->xShmMap)(psVar1,0,0x8000,0,&local_20);
      p->rc = iVar3;
      if (iVar3 == 0) {
        iVar6 = CONCAT44(*(undefined4 *)((long)local_20 + 0x28),
                         *(undefined4 *)((long)local_20 + 0x2c));
      }
    }
    else {
      iVar6 = 0;
    }
    p->iWalCksum = iVar6;
  }
  if (p->rc == 0) {
    if ((p->nFrame == 0) || ((pState != (RbuState *)0x0 && (pState->iWalCksum != p->iWalCksum)))) {
      p->rc = 0x65;
      p->eStage = 5;
    }
    else {
      psVar1 = p->pTargetFd->pReal;
      psVar2 = p->pTargetFd->pWalFd->pReal;
      iVar3 = (*psVar1->pMethods->xSectorSize)(psVar1);
      iVar4 = 1;
      if (p->pgsz < iVar3) {
        iVar4 = iVar3 / p->pgsz;
      }
      p->nPagePerSector = iVar4;
      iVar3 = (*psVar2->pMethods->xSync)(psVar2,2);
      p->rc = iVar3;
    }
  }
  return;
}

Assistant:

static void rbuSetupCheckpoint(sqlite3rbu *p, RbuState *pState){

  /* If pState is NULL, then the wal file may not have been opened and
  ** recovered. Running a read-statement here to ensure that doing so
  ** does not interfere with the "capture" process below.  */
  if( pState==0 ){
    p->eStage = 0;
    if( p->rc==SQLITE_OK ){
      p->rc = sqlite3_exec(p->dbMain, "SELECT * FROM sqlite_master", 0, 0, 0);
    }
  }

  /* Assuming no error has occurred, run a "restart" checkpoint with the
  ** sqlite3rbu.eStage variable set to CAPTURE. This turns on the following
  ** special behaviour in the rbu VFS:
  **
  **   * If the exclusive shm WRITER or READ0 lock cannot be obtained,
  **     the checkpoint fails with SQLITE_BUSY (normally SQLite would
  **     proceed with running a passive checkpoint instead of failing).
  **
  **   * Attempts to read from the *-wal file or write to the database file
  **     do not perform any IO. Instead, the frame/page combinations that
  **     would be read/written are recorded in the sqlite3rbu.aFrame[]
  **     array.
  **
  **   * Calls to xShmLock(UNLOCK) to release the exclusive shm WRITER, 
  **     READ0 and CHECKPOINT locks taken as part of the checkpoint are
  **     no-ops. These locks will not be released until the connection
  **     is closed.
  **
  **   * Attempting to xSync() the database file causes an SQLITE_INTERNAL 
  **     error.
  **
  ** As a result, unless an error (i.e. OOM or SQLITE_BUSY) occurs, the
  ** checkpoint below fails with SQLITE_INTERNAL, and leaves the aFrame[]
  ** array populated with a set of (frame -> page) mappings. Because the 
  ** WRITER, CHECKPOINT and READ0 locks are still held, it is safe to copy 
  ** data from the wal file into the database file according to the 
  ** contents of aFrame[].
  */
  if( p->rc==SQLITE_OK ){
    int rc2;
    p->eStage = RBU_STAGE_CAPTURE;
    rc2 = sqlite3_exec(p->dbMain, "PRAGMA main.wal_checkpoint=restart", 0, 0,0);
    if( rc2!=SQLITE_INTERNAL ) p->rc = rc2;
  }

  if( p->rc==SQLITE_OK && p->nFrame>0 ){
    p->eStage = RBU_STAGE_CKPT;
    p->nStep = (pState ? pState->nRow : 0);
    p->aBuf = rbuMalloc(p, p->pgsz);
    p->iWalCksum = rbuShmChecksum(p);
  }

  if( p->rc==SQLITE_OK ){
    if( p->nFrame==0 || (pState && pState->iWalCksum!=p->iWalCksum) ){
      p->rc = SQLITE_DONE;
      p->eStage = RBU_STAGE_DONE;
    }else{
      int nSectorSize;
      sqlite3_file *pDb = p->pTargetFd->pReal;
      sqlite3_file *pWal = p->pTargetFd->pWalFd->pReal;
      assert( p->nPagePerSector==0 );
      nSectorSize = pDb->pMethods->xSectorSize(pDb);
      if( nSectorSize>p->pgsz ){
        p->nPagePerSector = nSectorSize / p->pgsz;
      }else{
        p->nPagePerSector = 1;
      }

      /* Call xSync() on the wal file. This causes SQLite to sync the 
      ** directory in which the target database and the wal file reside, in 
      ** case it has not been synced since the rename() call in 
      ** rbuMoveOalFile(). */
      p->rc = pWal->pMethods->xSync(pWal, SQLITE_SYNC_NORMAL);
    }
  }
}